

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

ostream * operator<<(ostream *stream,NumberFormatter *formatter)

{
  void *pvVar1;
  ostream *this;
  fmtflags local_24;
  fmtflags *local_20;
  fmtflags *flags;
  NumberFormatter *formatter_local;
  ostream *stream_local;
  
  flags = (fmtflags *)formatter;
  formatter_local = (NumberFormatter *)stream;
  local_24 = std::ios_base::flags
                       ((ios_base *)
                        ((long)&stream->_vptr_basic_ostream + (long)stream->_vptr_basic_ostream[-3])
                       );
  local_20 = &local_24;
  if (*flags == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
    pvVar1 = (void *)std::ostream::operator<<(formatter_local,std::dec);
    std::ostream::operator<<(pvVar1,flags[1]);
  }
  else {
    this = std::operator<<((ostream *)formatter_local,"0x");
    pvVar1 = (void *)std::ostream::operator<<(this,std::hex);
    std::ostream::operator<<(pvVar1,flags[1]);
  }
  std::ios_base::flags
            ((ios_base *)
             ((long)&formatter_local->Format + *(long *)((long)*formatter_local + -0x18)),*local_20)
  ;
  return (ostream *)formatter_local;
}

Assistant:

std::ostream& operator<<(std::ostream& stream,
                         NumberFormatter const& formatter)
{
  auto const& flags = stream.flags();
  if (formatter.Format == FORMAT_DECIMAL) {
    stream << std::dec << formatter.Value;
  } else {
    stream << "0x" << std::hex << formatter.Value;
  }
  stream.flags(flags);
  return stream;
}